

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCProfile.cpp
# Opt level: O3

bool Assimp::IFC::ProcessProfile(IfcProfileDef *prof,TempMesh *meshout,ConversionData *conv)

{
  uint *puVar1;
  long lVar2;
  IfcBoundedCurve *curve;
  IfcParameterizedProfileDef *def;
  long *plVar3;
  size_type *psVar4;
  _func_int *p_Var5;
  allocator<char> local_1d1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  long *local_1b0 [2];
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  p_Var5 = (_func_int *)
           ((long)&(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                   _vptr_ObjectHelper +
           (long)(prof->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>).
                 _vptr_ObjectHelper[-3]);
  lVar2 = __dynamic_cast(p_Var5,&STEP::Object::typeinfo,
                         &Schema_2x3::IfcArbitraryClosedProfileDef::typeinfo,0xffffffffffffffff);
  if (lVar2 == 0) {
    lVar2 = __dynamic_cast(p_Var5,&STEP::Object::typeinfo,
                           &Schema_2x3::IfcArbitraryOpenProfileDef::typeinfo,0xffffffffffffffff);
    if (lVar2 == 0) {
      def = (IfcParameterizedProfileDef *)
            __dynamic_cast(p_Var5,&STEP::Object::typeinfo,
                           &Schema_2x3::IfcParameterizedProfileDef::typeinfo,0xffffffffffffffff);
      if (def == (IfcParameterizedProfileDef *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1b0,*(char **)(p_Var5 + 0x10),&local_1d1);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_1b0,0,(char *)0x0,0x6c00d7);
        psVar4 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar4) {
          local_1d0.field_2._M_allocated_capacity = *psVar4;
          local_1d0.field_2._8_8_ = plVar3[3];
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        }
        else {
          local_1d0.field_2._M_allocated_capacity = *psVar4;
          local_1d0._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_1d0._M_string_length = plVar3[1];
        *plVar3 = (long)psVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
        basic_formatter<std::__cxx11::string>
                  ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_190,
                   &local_1d0);
        LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_190);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
        std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
        if (local_1b0[0] == local_1a0) {
          return false;
        }
        operator_delete(local_1b0[0],local_1a0[0] + 1);
        return false;
      }
      ProcessParametrizedProfile(def,meshout,conv);
      goto LAB_00592a8d;
    }
    curve = STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcBoundedCurve>
                      (*(LazyObject **)(lVar2 + 0x68));
  }
  else {
    curve = (IfcBoundedCurve *)
            STEP::LazyObject::To<Assimp::IFC::Schema_2x3::IfcCurve>(*(LazyObject **)(lVar2 + 0x68));
  }
  ProcessCurve(&curve->super_IfcCurve,meshout,conv);
LAB_00592a8d:
  TempMesh::RemoveAdjacentDuplicates(meshout);
  puVar1 = (meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((meshout->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish == puVar1) {
    return false;
  }
  return 1 < *puVar1;
}

Assistant:

bool ProcessProfile(const Schema_2x3::IfcProfileDef& prof, TempMesh& meshout, ConversionData& conv)
{
    if(const Schema_2x3::IfcArbitraryClosedProfileDef* const cprofile = prof.ToPtr<Schema_2x3::IfcArbitraryClosedProfileDef>()) {
        ProcessClosedProfile(*cprofile,meshout,conv);
    }
    else if(const Schema_2x3::IfcArbitraryOpenProfileDef* const copen = prof.ToPtr<Schema_2x3::IfcArbitraryOpenProfileDef>()) {
        ProcessOpenProfile(*copen,meshout,conv);
    }
    else if(const Schema_2x3::IfcParameterizedProfileDef* const cparam = prof.ToPtr<Schema_2x3::IfcParameterizedProfileDef>()) {
        ProcessParametrizedProfile(*cparam,meshout,conv);
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcProfileDef entity, type is " + prof.GetClassName());
        return false;
    }
    meshout.RemoveAdjacentDuplicates();
    if (!meshout.mVertcnt.size() || meshout.mVertcnt.front() <= 1) {
        return false;
    }
    return true;
}